

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O3

void __thiscall
VariationalBayesEstimatorOnLDA::initializeParam(VariationalBayesEstimatorOnLDA *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  undefined8 *puVar1;
  pointer pvVar2;
  void *pvVar3;
  pointer pdVar4;
  pointer pdVar5;
  uint uVar6;
  ulong uVar7;
  size_type __n;
  pointer pvVar8;
  size_t __i;
  pointer pvVar9;
  double *pdVar10;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar11;
  double *pdVar12;
  size_type sVar13;
  uint *puVar14;
  pointer pvVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  vector<double,_std::allocator<double>_> ndkSum;
  random_device rnd;
  mt19937 mt;
  allocator_type local_2789;
  vector<double,_std::allocator<double>_> local_2788;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2768;
  vector<double,_std::allocator<double>_> *local_2750;
  ulong local_2748;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  pvVar15 = (this->_thetaEx).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_thetaEx).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar15) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      local_2740.field_0._M_file = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar20),(ulong)this->_K,
                 (value_type_conflict1 *)&local_2740);
      uVar19 = uVar19 + 1;
      pvVar15 = (this->_thetaEx).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->_thetaEx).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 3) *
              -0x5555555555555555;
      lVar20 = lVar20 + 0x18;
    } while (uVar19 <= uVar7 && uVar7 - uVar19 != 0);
  }
  pvVar15 = (this->_phiEx).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_phiEx).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar15) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      local_2740.field_0._M_file = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar20),(ulong)this->_V,
                 (value_type_conflict1 *)&local_2740);
      uVar19 = uVar19 + 1;
      pvVar15 = (this->_phiEx).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->_phiEx).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 3) *
              -0x5555555555555555;
      lVar20 = lVar20 + 0x18;
    } while (uVar19 <= uVar7 && uVar7 - uVar19 != 0);
  }
  pvVar15 = (this->_ndk).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_ndk).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar15) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      local_2740.field_0._M_file = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar20),(ulong)this->_K,
                 (value_type_conflict1 *)&local_2740);
      uVar19 = uVar19 + 1;
      pvVar15 = (this->_ndk).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->_ndk).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 3) *
              -0x5555555555555555;
      lVar20 = lVar20 + 0x18;
    } while (uVar19 <= uVar7 && uVar7 - uVar19 != 0);
  }
  pvVar15 = (this->_nkv).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_nkv).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar15) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      local_2740.field_0._M_file = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar20),(ulong)this->_V,
                 (value_type_conflict1 *)&local_2740);
      uVar19 = uVar19 + 1;
      pvVar15 = (this->_nkv).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->_nkv).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 3) *
              -0x5555555555555555;
      lVar20 = lVar20 + 0x18;
    } while (uVar19 <= uVar7 && uVar7 - uVar19 != 0);
  }
  this_00 = &this->_nk;
  local_2740.field_0._M_file = (void *)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (this_00,(ulong)this->_K,(value_type_conflict1 *)&local_2740);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar6 = std::random_device::_M_getval();
  local_13b8._M_x[0] = (unsigned_long)uVar6;
  lVar20 = 1;
  uVar19 = local_13b8._M_x[0];
  do {
    uVar19 = (ulong)(((uint)(uVar19 >> 0x1e) ^ (uint)uVar19) * 0x6c078965 + (int)lVar20);
    local_13b8._M_x[lVar20] = uVar19;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x270);
  local_13b8._M_p = 0x270;
  pvVar9 = (this->_docVoca->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2750 = this_00;
  if ((this->_docVoca->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar9) {
    uVar19 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_2768,
               (long)pvVar9[uVar19].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)pvVar9[uVar19].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,&local_2789);
      pvVar2 = (this->_qz).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           *(pointer *)
            ((long)&pvVar2[uVar19].
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data + 0x10);
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = *(pointer *)
                   &pvVar2[uVar19].
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data;
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = *(pointer *)
                    ((long)&pvVar2[uVar19].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
      pvVar2[uVar19].
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_2768.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&pvVar2[uVar19].
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data + 8) =
           local_2768.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&pvVar2[uVar19].
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) =
           local_2768.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2768.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2768.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2768.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2748 = uVar19;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_2788);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_2768);
      pvVar11 = this->_docVoca;
      pvVar9 = (pvVar11->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pvVar9[uVar19].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar9[uVar19].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n = (size_type)this->_K;
        uVar7 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_2788,__n,(allocator_type *)&local_2768);
          lVar20 = *(long *)&(this->_qz).
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar19].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          pvVar3 = *(void **)(lVar20 + uVar7 * 0x18);
          puVar1 = (undefined8 *)(lVar20 + uVar7 * 0x18);
          *puVar1 = local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar1[1] = local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *(pointer *)(lVar20 + 0x10 + uVar7 * 0x18) =
               local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pvVar3 != (void *)0x0) &&
             (operator_delete(pvVar3),
             local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (this->_K == 0) {
            lVar20 = *(long *)&(this->_qz).
                               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar19].
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            __n = 0;
          }
          else {
            uVar21 = 0;
            do {
              dVar22 = std::
                       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                 (&local_13b8);
              lVar20 = *(long *)&(this->_qz).
                                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data;
              *(double *)(*(long *)(lVar20 + uVar7 * 0x18) + uVar21 * 8) = dVar22 + 0.0;
              uVar21 = uVar21 + 1;
              __n = (size_type)this->_K;
            } while (uVar21 < __n);
          }
          dVar22 = 0.0;
          pdVar10 = *(double **)(lVar20 + uVar7 * 0x18);
          for (pdVar12 = pdVar10; pdVar12 != *(double **)(lVar20 + 8 + uVar7 * 0x18);
              pdVar12 = pdVar12 + 1) {
            dVar22 = dVar22 + *pdVar12;
          }
          if ((int)__n != 0) {
            sVar13 = 0;
            do {
              pdVar10[sVar13] = pdVar10[sVar13] / dVar22;
              sVar13 = sVar13 + 1;
            } while (__n != sVar13);
          }
          uVar7 = uVar7 + 1;
          pvVar11 = this->_docVoca;
          pvVar9 = (pvVar11->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)((long)pvVar9[uVar19].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)pvVar9[uVar19].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      uVar19 = local_2748 + 1;
      uVar7 = ((long)(pvVar11->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) *
              -0x5555555555555555;
    } while (uVar19 <= uVar7 && uVar7 - uVar19 != 0);
  }
  local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->_nd,(ulong)this->_D,(value_type_conflict1 *)&local_2788);
  uVar6 = this->_D;
  if ((ulong)uVar6 != 0) {
    pdVar4 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar9 = (this->_frequencyMatrix->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar19 = 0;
    do {
      dVar22 = 0.0;
      for (puVar14 = pvVar9[uVar19].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          puVar14 !=
          *(pointer *)
           ((long)&pvVar9[uVar19].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8); puVar14 = puVar14 + 1) {
        dVar22 = dVar22 + (double)*puVar14;
      }
      pdVar4[uVar19] = dVar22;
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar6);
  }
  pvVar15 = (this->_ndk).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar8 = (this->_ndk).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar8 != pvVar15) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar20),(ulong)this->_K,
                 (value_type_conflict1 *)&local_2788);
      uVar19 = uVar19 + 1;
      pvVar15 = (this->_ndk).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar8 = (this->_ndk).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar7 = ((long)pvVar8 - (long)pvVar15 >> 3) * -0x5555555555555555;
      lVar20 = lVar20 + 0x18;
    } while (uVar19 <= uVar7 && uVar7 - uVar19 != 0);
  }
  if (pvVar8 != pvVar15) {
    uVar19 = 0;
    do {
      if (pvVar15[uVar19].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar15[uVar19].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar7 = 0;
        do {
          dVar22 = std::
                   generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                             (&local_13b8);
          pvVar15 = (this->_ndk).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar4 = pvVar15[uVar19].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[uVar7] = dVar22 + 0.0;
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)pvVar15[uVar19].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
        pvVar8 = (this->_ndk).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar19 = uVar19 + 1;
      uVar7 = ((long)pvVar8 - (long)pvVar15 >> 3) * -0x5555555555555555;
    } while (uVar19 <= uVar7 && uVar7 - uVar19 != 0);
  }
  local_2768.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2788,(ulong)this->_D,(value_type_conflict1 *)&local_2768,
             (allocator_type *)&local_2789);
  pvVar15 = (this->_ndk).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar8 = (this->_ndk).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar20 = (long)pvVar8 - (long)pvVar15;
  if (lVar20 != 0) {
    lVar20 = (lVar20 >> 3) * -0x5555555555555555;
    lVar16 = 0;
    do {
      dVar22 = 0.0;
      for (pdVar10 = pvVar15[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar10 !=
          pvVar15[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish; pdVar10 = pdVar10 + 1) {
        dVar22 = dVar22 + *pdVar10;
      }
      local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar16] = dVar22;
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar20 + (ulong)(lVar20 == 0));
    if (pvVar8 != pvVar15) {
      pdVar4 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        pdVar5 = pvVar15[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar17 = (long)pvVar15[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar5;
        if (lVar17 != 0) {
          lVar17 = lVar17 >> 3;
          lVar18 = 0;
          do {
            pdVar5[lVar18] =
                 pdVar5[lVar18] /
                 (local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar16] / pdVar4[lVar16]);
            lVar18 = lVar18 + 1;
          } while (lVar17 + (ulong)(lVar17 == 0) != lVar18);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar20 + (ulong)(lVar20 == 0));
    }
  }
  pvVar15 = (this->_nkv).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar8 = (this->_nkv).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar8 == pvVar15) {
    uVar19 = 0;
  }
  else {
    lVar20 = 0;
    uVar7 = 0;
    do {
      local_2768.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar20),(ulong)this->_V,
                 (value_type_conflict1 *)&local_2768);
      uVar7 = uVar7 + 1;
      pvVar15 = (this->_nkv).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar8 = (this->_nkv).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar19 = ((long)pvVar8 - (long)pvVar15 >> 3) * -0x5555555555555555;
      lVar20 = lVar20 + 0x18;
    } while (uVar7 <= uVar19 && uVar19 - uVar7 != 0);
  }
  if (pvVar8 != pvVar15) {
    uVar7 = 0;
    do {
      if (pvVar15[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar15[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar19 = 0;
        do {
          dVar22 = std::
                   generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                             (&local_13b8);
          pvVar15 = (this->_nkv).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar4 = pvVar15[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[uVar19] = dVar22 + 0.0;
          uVar19 = uVar19 + 1;
        } while (uVar19 < (ulong)((long)pvVar15[uVar7].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
        pvVar8 = (this->_nkv).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = uVar7 + 1;
      uVar19 = ((long)pvVar8 - (long)pvVar15 >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar19 && uVar19 - uVar7 != 0);
  }
  dVar22 = 0.0;
  dVar23 = 0.0;
  if (uVar19 != 0) {
    uVar7 = 0;
    do {
      dVar24 = 0.0;
      for (pdVar10 = pvVar15[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar10 !=
          pvVar15[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish; pdVar10 = pdVar10 + 1) {
        dVar24 = dVar24 + *pdVar10;
      }
      dVar23 = dVar23 + dVar24;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar19);
  }
  pdVar10 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pdVar10 != pdVar12) {
    dVar22 = 0.0;
    do {
      dVar22 = dVar22 + *pdVar10;
      pdVar10 = pdVar10 + 1;
    } while (pdVar10 != pdVar12);
  }
  if (uVar19 != 0) {
    uVar7 = 0;
    do {
      pdVar4 = pvVar15[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar20 = (long)pvVar15[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar4;
      if (lVar20 != 0) {
        lVar20 = lVar20 >> 3;
        lVar16 = 0;
        do {
          pdVar4[lVar16] = pdVar4[lVar16] / (dVar23 / dVar22);
          lVar16 = lVar16 + 1;
        } while (lVar20 + (ulong)(lVar20 == 0) != lVar16);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar19);
  }
  local_2768.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (local_2750,(ulong)this->_K,(value_type_conflict1 *)&local_2768);
  uVar6 = this->_K;
  if ((ulong)uVar6 != 0) {
    pdVar4 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar15 = (this->_nkv).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar19 = 0;
    do {
      dVar22 = 0.0;
      for (pdVar10 = pvVar15[uVar19].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar10 !=
          *(pointer *)
           ((long)&pvVar15[uVar19].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8); pdVar10 = pdVar10 + 1) {
        dVar22 = dVar22 + *pdVar10;
      }
      pdVar4[uVar19] = dVar22;
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar6);
  }
  if (local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::initializeParam(){//{{{
    for(int d=0; d<_thetaEx.size(); d++)_thetaEx[d].assign(_K, 0);
    for(int k=0; k<_phiEx.size(); k++)_phiEx[k].assign(_V, 0);
    for(int d=0; d<_ndk.size(); d++)_ndk[d].assign(_K, 0);
    for(int k=0; k<_nkv.size(); k++)_nkv[k].assign(_V, 0);
    _nk.assign(_K, 0);

    random_device rnd;
    mt19937 mt(rnd());
    uniform_real_distribution<double> randN(0, 1);
    for(int d=0; d<_docVoca.size(); d++){
        _qz[d] = vector<vector<double> >(_docVoca[d].size());
        for(int l=0; l<_docVoca[d].size(); l++){
            _qz[d][l] = vector<double>(_K);
            for(int k=0; k<_K; k++){
                double randomValue = randN(mt);
                _qz[d][l][k] = randomValue;
            }
            double qzSum = accumulate(_qz[d][l].begin(), _qz[d][l].end(), 0.0);
            for(int k=0; k<_K; k++){
                _qz[d][l][k] /= qzSum;
            }
        }
    }

    _nd.assign(_D, 0);
    for(int d=0;d<_D;d++){
        _nd[d] = accumulate(_frequencyMatrix[d].begin(), _frequencyMatrix[d].end(), 0.0);
    }

    for(int d=0;d<_ndk.size();d++)_ndk[d].assign(_K, 0);
    for(int d=0;d<_ndk.size();d++){
        for(int k=0;k<_ndk[d].size();k++){
            double randomValue=randN(mt);
            _ndk[d][k] = randomValue;
        }
    }
    vector<double> ndkSum(_D, 0);
    for(int d=0;d<_ndk.size();d++){
        ndkSum[d] = accumulate(_ndk[d].begin(), _ndk[d].end(), 0.0);
    }
    for(int d=0;d<_ndk.size();d++){
        for(int k=0;k<_ndk[d].size();k++){
            _ndk[d][k] /= ndkSum[d]/_nd[d];
        }
    }

    for(int k=0;k<_nkv.size();k++)_nkv[k].assign(_V, 0);
    for(int k=0;k<_nkv.size();k++){
        for(int v=0;v<_nkv[k].size();v++){
            double randomValue=randN(mt);
            _nkv[k][v] = randomValue;
        }
    }
    double Z = 0;
    for(int k=0;k<_nkv.size();k++){
        Z += accumulate(_nkv[k].begin(), _nkv[k].end(), 0.0);
    }
    double wordCount = accumulate(_nd.begin(), _nd.end(), 0.0);
    for(int k=0;k<_nkv.size();k++){
        for(int v=0;v<_nkv[k].size();v++){
            _nkv[k][v] /= Z/wordCount;
        }
    }

    _nk.assign(_K, 0);
    for(int k=0;k<_K;k++){
        _nk[k] = accumulate(_nkv[k].begin(), _nkv[k].end(), 0.0);
    }

}